

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O2

void opengv::absolute_pose::Jac
               (Matrix<double,_10,_10,_0,_10,_10> *M,Matrix<double,_1,_10,_1,_1,_10> *C,double gamma
               ,Matrix3d *Jac)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  
  auVar24 = ZEXT816(0x4010000000000000);
  auVar26 = ZEXT816(0x4000000000000000);
  auVar25 = ZEXT816(0xc010000000000000);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (M->super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>).m_storage.
                 m_data.array[0x2c];
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (M->super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>).m_storage.m_data.array
       [10] * 4.0;
  auVar2 = vfmadd231sd_fma(auVar27,auVar26,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (M->super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>).m_storage.
                 m_data.array[0];
  auVar2 = vfmadd231sd_fma(auVar2,auVar25,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.
                 m_data.array[1];
  auVar2 = vfmadd231sd_fma(auVar2,auVar24,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.
                 m_data.array[0];
  auVar2 = vfmadd231sd_fma(auVar2,auVar25,auVar5);
  (Jac->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       auVar2._0_8_;
  dVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>).m_storage.m_data.
          array[0x46];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (M->super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>).m_storage.
                 m_data.array[0x2d];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar1 + dVar1;
  auVar2 = vfmadd231sd_fma(auVar28,auVar26,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.
                 m_data.array[7];
  auVar2 = vfmadd231sd_fma(auVar2,auVar26,auVar7);
  (Jac->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       auVar2._0_8_;
  dVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>).m_storage.m_data.
          array[0x50];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (M->super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>).m_storage.
                 m_data.array[0x2e];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar1 + dVar1;
  auVar2 = vfmadd231sd_fma(auVar29,auVar26,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.
                 m_data.array[8];
  auVar2 = vfmadd231sd_fma(auVar2,auVar26,auVar9);
  (Jac->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       auVar2._0_8_;
  dVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>).m_storage.m_data.
          array[0x46];
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (M->super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>).m_storage.m_data.array
       [0x36];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar1 + dVar1;
  auVar2 = vfmadd231sd_fma(auVar30,auVar26,auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[7]
  ;
  auVar2 = vfmadd231sd_fma(auVar2,auVar26,auVar11);
  (Jac->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1] =
       auVar2._0_8_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (M->super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>).m_storage.m_data.array
       [0x37];
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       (M->super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>).m_storage.m_data.array
       [0x14] * 4.0;
  auVar2 = vfmadd231sd_fma(auVar31,auVar26,auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (M->super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>).m_storage.m_data.array
       [0];
  auVar2 = vfmadd231sd_fma(auVar2,auVar25,auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[2]
  ;
  auVar2 = vfmadd231sd_fma(auVar2,auVar24,auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[0]
  ;
  auVar2 = vfmadd231sd_fma(auVar2,auVar25,auVar15);
  (Jac->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       auVar2._0_8_;
  dVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>).m_storage.m_data.
          array[0x5a];
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (M->super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>).m_storage.m_data.array
       [0x38];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar1 + dVar1;
  auVar2 = vfmadd231sd_fma(auVar32,auVar26,auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[9]
  ;
  auVar2 = vfmadd231sd_fma(auVar2,auVar26,auVar17);
  (Jac->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       auVar2._0_8_;
  dVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>).m_storage.m_data.
          array[0x50];
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (M->super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>).m_storage.m_data.array
       [0x40];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar1 + dVar1;
  auVar2 = vfmadd231sd_fma(auVar33,auVar26,auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[8]
  ;
  auVar2 = vfmadd231sd_fma(auVar2,auVar26,auVar19);
  (Jac->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2] =
       auVar2._0_8_;
  dVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>).m_storage.m_data.
          array[0x5a];
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (M->super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>).m_storage.m_data.array
       [0x41];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar1 + dVar1;
  auVar2 = vfmadd231sd_fma(auVar34,auVar26,auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[9]
  ;
  auVar2 = vfmadd231sd_fma(auVar2,auVar26,auVar21);
  (Jac->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5] =
       auVar2._0_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (M->super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>).m_storage.m_data.array
       [0x42];
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       (M->super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>).m_storage.m_data.array
       [0x1e] * 4.0;
  auVar2 = vfmadd231sd_fma(auVar35,auVar26,auVar22);
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (M->super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>).m_storage.m_data.array
       [0];
  auVar2 = vfmadd231sd_fma(auVar2,auVar25,auVar26);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[3]
  ;
  auVar2 = vfmadd231sd_fma(auVar2,auVar24,auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[0]
  ;
  auVar2 = vfmadd231sd_fma(auVar2,auVar25,auVar24);
  (Jac->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       auVar2._0_8_;
  return;
}

Assistant:

void Jac(
    const Eigen::Matrix<double,10,10> & M,
    const Eigen::Matrix<double,1,10> & C,
    double gamma,
    Eigen::Matrix3d & Jac )
{
  Jac(0,0) = (2*M(4,4)+4*M(0,1)-4*M(0,0)+4*C(0,1)-4*C(0,0));
  Jac(0,1) = (2*M(5,4)+2*M(0,7)+2*C(0,7));
  Jac(0,2) = (2*M(6,4)+2*M(0,8)+2*C(0,8));
  Jac(1,0) = (2*M(4,5)+2*M(0,7)+2*C(0,7));
  Jac(1,1) = (2*M(5,5)+4*M(0,2)-4*M(0,0)+4*C(0,2)-4*C(0,0));
  Jac(1,2) = (2*M(6,5)+2*M(0,9)+2*C(0,9));
  Jac(2,0) = (2*M(4,6)+2*M(0,8)+2*C(0,8));
  Jac(2,1) = (2*M(5,6)+2*M(0,9)+2*C(0,9));
  Jac(2,2) = (2*M(6,6)+4*M(0,3)-4*M(0,0)+4*C(0,3)-4*C(0,0));
}